

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm_manager.cc
# Opt level: O2

RC __thiscall SM_Manager::PrintPageStats(SM_Manager *this)

{
  int *piVar1;
  int *piVar2;
  int *piVar3;
  ostream *poVar4;
  
  piVar1 = StatisticsMgr::Get(pStatisticsMgr,PF_GETPAGE);
  piVar2 = StatisticsMgr::Get(pStatisticsMgr,PF_PAGEFOUND);
  piVar3 = StatisticsMgr::Get(pStatisticsMgr,PF_PAGENOTFOUND);
  poVar4 = std::operator<<((ostream *)&std::cout,"PF Layer Statistics");
  std::endl<char,std::char_traits<char>>(poVar4);
  poVar4 = std::operator<<((ostream *)&std::cout,"-------------------");
  std::endl<char,std::char_traits<char>>(poVar4);
  if (piVar1 == (int *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Total number of calls to GetPage Routine: None")
    ;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Total number of calls to GetPage Routine: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar1);
  }
  std::endl<char,std::char_traits<char>>(poVar4);
  if (piVar2 == (int *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"  Number found: None");
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"  Number found: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar2);
  }
  std::endl<char,std::char_traits<char>>(poVar4);
  if (piVar3 == (int *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"  Number found: None");
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"  Number not found: ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar3);
  }
  std::endl<char,std::char_traits<char>>(poVar4);
  return 0;
}

Assistant:

RC SM_Manager::PrintPageStats(){
  int *piGP = pStatisticsMgr->Get(PF_GETPAGE);
  int *piPF = pStatisticsMgr->Get(PF_PAGEFOUND);
  int *piPNF = pStatisticsMgr->Get(PF_PAGENOTFOUND);

  cout << "PF Layer Statistics" << endl;
  cout << "-------------------" << endl;
  if(piGP)
    cout << "Total number of calls to GetPage Routine: " << *piGP << endl;
  else
    cout << "Total number of calls to GetPage Routine: None" << endl;
  if(piPF)
    cout << "  Number found: " << *piPF << endl;
  else
    cout << "  Number found: None" << endl;
  if(piPNF)
    cout << "  Number not found: " << *piPNF << endl;
  else
    cout << "  Number found: None" << endl;
  return (0);
}